

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

IntrusiveList<SynBase> ParseExpressions(ParseContext *ctx)

{
  SynBase *node;
  SynBase *expression;
  ParseContext *ctx_local;
  IntrusiveList<SynBase> expressions;
  
  IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&ctx_local);
  while( true ) {
    node = ParseExpression(ctx);
    if (node == (SynBase *)0x0) break;
    IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&ctx_local,node);
  }
  return _ctx_local;
}

Assistant:

IntrusiveList<SynBase> ParseExpressions(ParseContext &ctx)
{
	IntrusiveList<SynBase> expressions;

	while(SynBase* expression = ParseExpression(ctx))
		expressions.push_back(expression);

	return expressions;
}